

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTest.cpp
# Opt level: O2

void __thiscall
ninx_parser::test_parse_block_not_closing::test_method(test_parse_block_not_closing *this)

{
  undefined1 local_3a0 [8];
  allocator local_398 [8];
  undefined1 local_390 [16];
  undefined1 local_380 [24];
  char *local_368;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  tokens;
  string local_348;
  string origin;
  Lexer lexer;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  Parser parser;
  istringstream ss;
  
  std::__cxx11::string::string
            ((string *)&lexer,"$a = {    this block will not close",(allocator *)&parser);
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&lexer,_S_in);
  std::__cxx11::string::~string((string *)&lexer);
  std::__cxx11::string::string((string *)&origin,"test",(allocator *)&lexer);
  std::__cxx11::string::string((string *)&local_348,"tests",(allocator *)&parser);
  ninx::lexer::Lexer::Lexer(&lexer,(istream *)&ss,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  ninx::lexer::Lexer::generate(&tokens,&lexer);
  std::__cxx11::string::string((string *)local_380,"tests",local_398);
  ninx::parser::Parser::Parser(&parser,&tokens,(string *)local_380);
  std::__cxx11::string::~string((string *)local_380);
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/test/parser/ParserTest.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x2c);
  ninx::parser::Parser::parse((Parser *)local_3a0);
  if (local_3a0 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_3a0 + 8))();
  }
  local_3a0 = (undefined1  [8])0x0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/test/parser/ParserTest.cpp"
  ;
  local_238 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x2c);
  local_398[0] = (allocator)0x0;
  local_390._0_8_ = 0;
  local_390._8_8_ = 0;
  local_380[8] = 0;
  local_380._0_8_ = &PTR__lazy_ostream_001feb00;
  local_380._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_368 = "exception ninx::parser::exception::ParserException expected but not raised";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_390 + 8));
  ninx::parser::Parser::~Parser(&parser);
  std::
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ::~vector(&tokens);
  ninx::lexer::Lexer::~Lexer(&lexer);
  std::__cxx11::string::~string((string *)&origin);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_parse_block_not_closing)
    {
        std::istringstream ss(
                "$a = {"
                "    this block will not close"
                );
        std::string origin {"test"};
        ninx::lexer::Lexer lexer {ss, "tests"};
        auto tokens = lexer.generate();
        ninx::parser::Parser parser{tokens, "tests"};

        BOOST_CHECK_THROW(parser.parse(), ninx::parser::exception::ParserException);
    }